

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool __thiscall storage::BTInnerNode::search_node(BTInnerNode *this,int key,BTNode **out_record)

{
  int iVar1;
  int local_30;
  int M;
  int R;
  int L;
  BTNode **out_record_local;
  int key_local;
  BTInnerNode *this_local;
  
  M = 0;
  iVar1 = (this->super_BTNode).used_links_count_ + -1;
  while( true ) {
    local_30 = iVar1;
    if (local_30 <= M) {
      *out_record = this->links_[M];
      return true;
    }
    iVar1 = M + (local_30 - M >> 1);
    if ((this->super_BTNode).keys_[iVar1] == key) break;
    if ((this->super_BTNode).keys_[iVar1] <= key) {
      M = iVar1 + 1;
      iVar1 = local_30;
    }
  }
  *out_record = this->links_[iVar1 + 1];
  return true;
}

Assistant:

bool BTInnerNode::search_node(int key, BTNode *&out_record) {
        int L = 0, R = used_links_count_ - 1;
        while (L < R) {
            int M = L + ((R - L) >> 1);   // avoid (L+R)/2 overflow
            if (keys_[M] == key) {
                out_record = links_[M + 1];
                return true;
            } else if (keys_[M] > key)
                R = M;
            else
                L = 1 + M;
        }
        out_record = links_[L];
        return true;
    }